

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# downloader.h
# Opt level: O1

void __thiscall Downloader::Uninstall(Downloader *this,string *package)

{
  pointer pcVar1;
  bool bVar2;
  uint uVar3;
  ostream *poVar4;
  int iVar5;
  size_t __nbytes;
  void *__buf;
  void *__buf_00;
  int iVar6;
  string compiler;
  PackageList packagelist;
  DownloadPackage inpack;
  CCDir ccdir;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Package>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Package>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Package>_>_>
  local_380;
  DownloadPackage local_350;
  CCDir local_2c0;
  CCDir local_1e0;
  CCDir local_100;
  
  get_compiler_abi_cxx11_(&local_3a0,this,true);
  local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3c0,local_3a0._M_dataplus._M_p,
             local_3a0._M_dataplus._M_p + local_3a0._M_string_length);
  MakeCCDir(&local_2c0,this,&local_3c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
    operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
  }
  pcVar1 = (package->_M_dataplus)._M_p;
  local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3e0,pcVar1,pcVar1 + package->_M_string_length);
  LibParse(&local_350,this,&local_3e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
    operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
  }
  local_380._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_380._M_impl.super__Rb_tree_header._M_header;
  local_380._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  __nbytes = 0;
  local_380._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_380._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_380._M_impl.super__Rb_tree_header._M_header._M_right =
       local_380._M_impl.super__Rb_tree_header._M_header._M_left;
  CCDir::CCDir(&local_100,&local_2c0);
  PackageList::read((PackageList *)&local_380,(int)&local_100,__buf,__nbytes);
  CCDir::~CCDir(&local_100);
  local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_350.libname._M_dataplus._M_p,
             local_350.libname._M_dataplus._M_p + local_350.libname._M_string_length);
  bVar2 = PackageList::erase((PackageList *)&local_380,&local_400);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400._M_dataplus._M_p != &local_400.field_2) {
    operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
  }
  if (bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Successfully uninstalled ",0x19);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_350.libname._M_dataplus._M_p,
                        local_350.libname._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    goto LAB_001205f3;
  }
  iVar6 = -0x37;
  if ((byte)(ispring::xout[0x36] - 0x30) < 10) {
    iVar5 = -0x30;
LAB_00120540:
    printf("%s",(&PTR_anon_var_dwarf_2a93_001519e0)[iVar5 + (uint)ispring::xout[0x36]]);
  }
  else {
    iVar5 = -0x37;
    if ((byte)(ispring::xout[0x36] + 0xbf) < 6) goto LAB_00120540;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"WARNING: Skipping ",0x12);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_350.libname._M_dataplus._M_p,
                      local_350.libname._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," as it is not installed.",0x18);
  uVar3 = (uint)ispring::xout[0x37];
  __nbytes = (size_t)(uVar3 - 0x30);
  if ((byte)(uVar3 - 0x30) < 10) {
    iVar6 = -0x30;
LAB_001205c3:
    printf("%s",(&PTR_anon_var_dwarf_2a93_001519e0)[iVar6 + uVar3]);
  }
  else {
    __nbytes = (size_t)(uVar3 - 0x41);
    if ((byte)(uVar3 - 0x41) < 6) goto LAB_001205c3;
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
LAB_001205f3:
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  CCDir::CCDir(&local_1e0,&local_2c0);
  PackageList::write((PackageList *)&local_380,(int)&local_1e0,__buf_00,__nbytes);
  CCDir::~CCDir(&local_1e0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Package>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Package>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Package>_>_>
  ::~_Rb_tree(&local_380);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350.url._M_dataplus._M_p != &local_350.url.field_2) {
    operator_delete(local_350.url._M_dataplus._M_p,local_350.url.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_350.options._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350.version._M_dataplus._M_p != &local_350.version.field_2) {
    operator_delete(local_350.version._M_dataplus._M_p,
                    local_350.version.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350.libname._M_dataplus._M_p != &local_350.libname.field_2) {
    operator_delete(local_350.libname._M_dataplus._M_p,
                    local_350.libname.field_2._M_allocated_capacity + 1);
  }
  CCDir::~CCDir(&local_2c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
    operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Uninstall(std::string package){
        std::string compiler=get_compiler();
        CCDir ccdir=MakeCCDir(compiler);
        DownloadPackage inpack=LibParse(package);
        PackageList packagelist;
        packagelist.read(ccdir);
        if(packagelist.erase(inpack.libname)){
            std::cout << "Successfully uninstalled " << inpack.libname << std::endl;
        }else{
            std::cout << ispring::xout.yellow << "WARNING: Skipping " << inpack.libname << " as it is not installed." << ispring::xout.white << std::endl;
        }
        packagelist.write(ccdir);
    }